

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int clearCell(MemPage *pPage,uchar *pCell,CellInfo *pInfo)

{
  BtShared *pBt;
  bool bVar1;
  uint ovfl;
  uint uVar2;
  MemPage *pOvfl;
  Pgno iNext;
  MemPage *local_40;
  Pgno local_34;
  int iVar3;
  ulong uVar4;
  
  (*pPage->xParseCell)(pPage,pCell,pInfo);
  uVar2 = 0;
  if (pInfo->nPayload != (uint)pInfo->nLocal) {
    if (pPage->aDataEnd < pCell + pInfo->nSize) {
      uVar2 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10fd6,
                  "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
    }
    else {
      uVar2 = *(uint *)(pCell + pInfo->nSize + -4);
      ovfl = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      pBt = pPage->pBt;
      uVar4 = (ulong)((pInfo->nPayload + ~(uint)pInfo->nLocal + pBt->usableSize) - 4) /
              (ulong)(pBt->usableSize - 4);
      do {
        iVar3 = (int)uVar4;
        uVar2 = iVar3 - 1;
        uVar4 = (ulong)uVar2;
        if (iVar3 == 0) {
          return 0;
        }
        local_34 = 0;
        local_40 = (MemPage *)0x0;
        if ((ovfl < 2) || (pBt->nPage < ovfl)) {
          bVar1 = false;
          uVar2 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10fe7,
                      "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
        }
        else {
          if ((uVar2 == 0) || (uVar2 = getOverflowPage(pBt,ovfl,&local_40,&local_34), uVar2 == 0)) {
            if (((local_40 == (MemPage *)0x0) &&
                (local_40 = btreePageLookup(pBt,ovfl), local_40 == (MemPage *)0x0)) ||
               (local_40->pDbPage->nRef == 1)) {
              uVar2 = freePage2(pBt,local_40,ovfl);
            }
            else {
              uVar2 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10ffb,
                          "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
            }
            if ((local_40 != (MemPage *)0x0) && (local_40->pDbPage != (DbPage *)0x0)) {
              sqlite3PagerUnrefNotNull(local_40->pDbPage);
            }
            if (uVar2 == 0) {
              bVar1 = true;
              uVar2 = (uint)pInfo;
              ovfl = local_34;
              goto LAB_00177807;
            }
          }
          bVar1 = false;
        }
LAB_00177807:
        pInfo = (CellInfo *)(ulong)uVar2;
      } while (bVar1);
    }
  }
  return uVar2;
}

Assistant:

static int clearCell(
  MemPage *pPage,          /* The page that contains the Cell */
  unsigned char *pCell,    /* First byte of the Cell */
  CellInfo *pInfo          /* Size information about the cell */
){
  BtShared *pBt;
  Pgno ovflPgno;
  int rc;
  int nOvfl;
  u32 ovflPageSize;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pPage->xParseCell(pPage, pCell, pInfo);
  if( pInfo->nLocal==pInfo->nPayload ){
    return SQLITE_OK;  /* No overflow pages. Return without doing anything */
  }
  testcase( pCell + pInfo->nSize == pPage->aDataEnd );
  testcase( pCell + (pInfo->nSize-1) == pPage->aDataEnd );
  if( pCell + pInfo->nSize > pPage->aDataEnd ){
    /* Cell extends past end of page */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  ovflPgno = get4byte(pCell + pInfo->nSize - 4);
  pBt = pPage->pBt;
  assert( pBt->usableSize > 4 );
  ovflPageSize = pBt->usableSize - 4;
  nOvfl = (pInfo->nPayload - pInfo->nLocal + ovflPageSize - 1)/ovflPageSize;
  assert( nOvfl>0 || 
    (CORRUPT_DB && (pInfo->nPayload + ovflPageSize)<ovflPageSize)
  );
  while( nOvfl-- ){
    Pgno iNext = 0;
    MemPage *pOvfl = 0;
    if( ovflPgno<2 || ovflPgno>btreePagecount(pBt) ){
      /* 0 is not a legal page number and page 1 cannot be an 
      ** overflow page. Therefore if ovflPgno<2 or past the end of the 
      ** file the database must be corrupt. */
      return SQLITE_CORRUPT_BKPT;
    }
    if( nOvfl ){
      rc = getOverflowPage(pBt, ovflPgno, &pOvfl, &iNext);
      if( rc ) return rc;
    }

    if( ( pOvfl || ((pOvfl = btreePageLookup(pBt, ovflPgno))!=0) )
     && sqlite3PagerPageRefcount(pOvfl->pDbPage)!=1
    ){
      /* There is no reason any cursor should have an outstanding reference 
      ** to an overflow page belonging to a cell that is being deleted/updated.
      ** So if there exists more than one reference to this page, then it 
      ** must not really be an overflow page and the database must be corrupt. 
      ** It is helpful to detect this before calling freePage2(), as 
      ** freePage2() may zero the page contents if secure-delete mode is
      ** enabled. If this 'overflow' page happens to be a page that the
      ** caller is iterating through or using in some other way, this
      ** can be problematic.
      */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = freePage2(pBt, pOvfl, ovflPgno);
    }

    if( pOvfl ){
      sqlite3PagerUnref(pOvfl->pDbPage);
    }
    if( rc ) return rc;
    ovflPgno = iNext;
  }
  return SQLITE_OK;
}